

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int rtreeConstraintError(Rtree *pRtree,int iCol)

{
  char *pcVar1;
  char *pcVar2;
  int local_4c;
  char *zCol2;
  char *zCol1;
  char *zCol;
  int rc;
  char *zSql;
  sqlite3_stmt *pStmt;
  Rtree *pRStack_10;
  int iCol_local;
  Rtree *pRtree_local;
  
  zSql = (char *)0x0;
  pStmt._4_4_ = iCol;
  pRStack_10 = pRtree;
  pcVar1 = sqlite3_mprintf("SELECT * FROM %Q.%Q",pRtree->zDb,pRtree->zName);
  if (pcVar1 == (char *)0x0) {
    zCol._4_4_ = 7;
  }
  else {
    zCol._4_4_ = sqlite3_prepare_v2(pRStack_10->db,pcVar1,-1,(sqlite3_stmt **)&zSql,(char **)0x0);
  }
  sqlite3_free(pcVar1);
  if (zCol._4_4_ == 0) {
    if (pStmt._4_4_ == 0) {
      pcVar1 = sqlite3_column_name((sqlite3_stmt *)zSql,0);
      pcVar1 = sqlite3_mprintf("UNIQUE constraint failed: %s.%s",pRStack_10->zName,pcVar1);
      (pRStack_10->base).zErrMsg = pcVar1;
    }
    else {
      pcVar1 = sqlite3_column_name((sqlite3_stmt *)zSql,pStmt._4_4_);
      pcVar2 = sqlite3_column_name((sqlite3_stmt *)zSql,pStmt._4_4_ + 1);
      pcVar1 = sqlite3_mprintf("rtree constraint failed: %s.(%s<=%s)",pRStack_10->zName,pcVar1,
                               pcVar2);
      (pRStack_10->base).zErrMsg = pcVar1;
    }
  }
  sqlite3_finalize((sqlite3_stmt *)zSql);
  if (zCol._4_4_ == 0) {
    local_4c = 0x13;
  }
  else {
    local_4c = zCol._4_4_;
  }
  return local_4c;
}

Assistant:

static int rtreeConstraintError(Rtree *pRtree, int iCol){
  sqlite3_stmt *pStmt = 0;
  char *zSql; 
  int rc;

  assert( iCol==0 || iCol%2 );
  zSql = sqlite3_mprintf("SELECT * FROM %Q.%Q", pRtree->zDb, pRtree->zName);
  if( zSql ){
    rc = sqlite3_prepare_v2(pRtree->db, zSql, -1, &pStmt, 0);
  }else{
    rc = SQLITE_NOMEM;
  }
  sqlite3_free(zSql);

  if( rc==SQLITE_OK ){
    if( iCol==0 ){
      const char *zCol = sqlite3_column_name(pStmt, 0);
      pRtree->base.zErrMsg = sqlite3_mprintf(
          "UNIQUE constraint failed: %s.%s", pRtree->zName, zCol
      );
    }else{
      const char *zCol1 = sqlite3_column_name(pStmt, iCol);
      const char *zCol2 = sqlite3_column_name(pStmt, iCol+1);
      pRtree->base.zErrMsg = sqlite3_mprintf(
          "rtree constraint failed: %s.(%s<=%s)", pRtree->zName, zCol1, zCol2
      );
    }
  }

  sqlite3_finalize(pStmt);
  return (rc==SQLITE_OK ? SQLITE_CONSTRAINT : rc);
}